

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# content_encoding.c
# Opt level: O3

CURLcode Curl_build_unencoding_stack(Curl_easy *data,char *enclist,int maybechunked)

{
  undefined1 *puVar1;
  uint uVar2;
  int iVar3;
  CURLcode CVar4;
  size_t sVar5;
  contenc_writer *pcVar6;
  contenc_writer *pcVar7;
  ulong uVar8;
  uint uVar9;
  content_encoding **ppcVar10;
  size_t max;
  content_encoding *ce;
  content_encoding *pcVar11;
  byte *pbVar12;
  
  uVar2 = 0;
LAB_005b699b:
  while ((uVar8 = (ulong)(byte)*enclist, uVar8 < 0x2d &&
         ((0x100100000200U >> (uVar8 & 0x3f) & 1) != 0))) {
    enclist = (char *)((byte *)enclist + 1);
  }
  sVar5 = 1;
  max = 0;
  pbVar12 = (byte *)enclist;
  do {
    uVar9 = (uint)uVar8;
    if (uVar9 < 0x20) {
      if (uVar9 != 9) {
        if (uVar9 != 0) goto LAB_005b69d9;
        break;
      }
    }
    else if (uVar9 != 0x20) {
      if (uVar9 == 0x2c) break;
LAB_005b69d9:
      if (3 < (byte)((char)uVar8 - 10U)) {
        max = sVar5;
      }
    }
    uVar8 = (ulong)pbVar12[1];
    pbVar12 = pbVar12 + 1;
    sVar5 = sVar5 + 1;
  } while( true );
  if (max == 7 && maybechunked != 0) {
    iVar3 = Curl_strncasecompare(enclist,"chunked",7);
    if (iVar3 != 0) {
      puVar1 = &(data->req).field_0xd9;
      *puVar1 = *puVar1 | 0x20;
      Curl_httpchunk_init(data);
      goto LAB_005b6b4c;
    }
  }
  else if (max == 0) goto LAB_005b6b4c;
  ppcVar10 = encodings;
  pcVar11 = &identity_encoding;
  do {
    ppcVar10 = ppcVar10 + 1;
    iVar3 = Curl_strncasecompare(enclist,pcVar11->name,max);
    if (((iVar3 != 0) && (pcVar11->name[max] == '\0')) ||
       ((pcVar11->alias != (char *)0x0 &&
        ((iVar3 = Curl_strncasecompare(enclist,pcVar11->alias,max), iVar3 != 0 &&
         (pcVar11->alias[max] == '\0')))))) goto LAB_005b6a96;
    pcVar11 = *ppcVar10;
  } while (pcVar11 != (content_encoding *)0x0);
  pcVar11 = (content_encoding *)0x0;
LAB_005b6a96:
  pcVar6 = (data->req).writer_stack;
  if (pcVar6 == (contenc_writer *)0x0) {
    pcVar6 = (contenc_writer *)(*Curl_ccalloc)(1,0x10);
    if (pcVar6 == (contenc_writer *)0x0) {
      (data->req).writer_stack = (contenc_writer *)0x0;
      return CURLE_OUT_OF_MEMORY;
    }
    pcVar6->handler = &client_encoding;
    pcVar6->downstream = (contenc_writer *)0x0;
    (data->req).writer_stack = pcVar6;
  }
  if (3 < (int)uVar2) {
    Curl_failf(data,"Reject response due to %u content encodings",(ulong)(uVar2 + 1));
    return CURLE_BAD_CONTENT_ENCODING;
  }
  if (pcVar11 == (content_encoding *)0x0) {
    pcVar11 = &error_encoding;
  }
  pcVar7 = (contenc_writer *)(*Curl_ccalloc)(1,pcVar11->writersize);
  if (pcVar7 == (contenc_writer *)0x0) {
    return CURLE_OUT_OF_MEMORY;
  }
  pcVar7->handler = pcVar11;
  pcVar7->downstream = pcVar6;
  CVar4 = (*pcVar11->init_writer)(data,pcVar7);
  if (CVar4 != CURLE_OK) {
    (*Curl_cfree)(pcVar7);
    return CURLE_OUT_OF_MEMORY;
  }
  (data->req).writer_stack = pcVar7;
  uVar2 = uVar2 + 1;
LAB_005b6b4c:
  enclist = (char *)pbVar12;
  if (*pbVar12 == 0) {
    return CURLE_OK;
  }
  goto LAB_005b699b;
}

Assistant:

CURLcode Curl_build_unencoding_stack(struct Curl_easy *data,
                                     const char *enclist, int maybechunked)
{
  struct SingleRequest *k = &data->req;
  int counter = 0;

  do {
    const char *name;
    size_t namelen;

    /* Parse a single encoding name. */
    while(ISBLANK(*enclist) || *enclist == ',')
      enclist++;

    name = enclist;

    for(namelen = 0; *enclist && *enclist != ','; enclist++)
      if(!ISSPACE(*enclist))
        namelen = enclist - name + 1;

    /* Special case: chunked encoding is handled at the reader level. */
    if(maybechunked && namelen == 7 && strncasecompare(name, "chunked", 7)) {
      k->chunk = TRUE;             /* chunks coming our way. */
      Curl_httpchunk_init(data);   /* init our chunky engine. */
    }
    else if(namelen) {
      const struct content_encoding *encoding = find_encoding(name, namelen);
      struct contenc_writer *writer;

      if(!k->writer_stack) {
        k->writer_stack = new_unencoding_writer(data, &client_encoding, NULL);

        if(!k->writer_stack)
          return CURLE_OUT_OF_MEMORY;
      }

      if(!encoding)
        encoding = &error_encoding;  /* Defer error at stack use. */

      if(++counter >= MAX_ENCODE_STACK) {
        failf(data, "Reject response due to %u content encodings",
              counter);
        return CURLE_BAD_CONTENT_ENCODING;
      }
      /* Stack the unencoding stage. */
      writer = new_unencoding_writer(data, encoding, k->writer_stack);
      if(!writer)
        return CURLE_OUT_OF_MEMORY;
      k->writer_stack = writer;
    }
  } while(*enclist);

  return CURLE_OK;
}